

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestEmptyMessageWithExtensionsLite::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestEmptyMessageWithExtensionsLite *_this;
  TestEmptyMessageWithExtensionsLite *local_20;
  LogMessageFatal local_18;
  
  local_20 = (TestEmptyMessageWithExtensionsLite *)to_msg;
  local_18.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestEmptyMessageWithExtensionsLite_const*,proto2_unittest::TestEmptyMessageWithExtensionsLite*>
                          ((TestEmptyMessageWithExtensionsLite **)&local_18,&local_20,
                           "&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::internal::ExtensionSet::MergeFrom
              (&(local_20->field_0)._impl_._extensions_,
               (MessageLite *)_TestEmptyMessageWithExtensionsLite_default_instance_,
               (ExtensionSet *)(from_msg + 1));
    google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
              (&(local_20->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x256c,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

void TestEmptyMessageWithExtensionsLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEmptyMessageWithExtensionsLite*>(&to_msg);
  auto& from = static_cast<const TestEmptyMessageWithExtensionsLite&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestEmptyMessageWithExtensionsLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}